

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::SymHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,SymHash *this,string *name)

{
  element_type *peVar1;
  Elf64_Addr EVar2;
  Elf64_Xword EVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  uint uVar8;
  Word WVar9;
  undefined1 auStack_70 [8];
  value_type candidate;
  string candidateName;
  
  if (name->_M_string_length == 0) {
    uVar5 = 0;
  }
  else {
    sVar7 = 0;
    uVar5 = 0;
    do {
      uVar8 = uVar5 * 0x10 + (int)(name->_M_dataplus)._M_p[sVar7];
      uVar5 = uVar8 & 0xf0000000;
      uVar5 = ~uVar5 & (uVar5 >> 0x18 ^ uVar8);
      sVar7 = sVar7 + 1;
    } while (name->_M_string_length != sVar7);
  }
  WVar9 = this->buckets[(ulong)uVar5 % (ulong)this->nbucket];
  candidateName.field_2._8_8_ = __return_storage_ptr__;
  while( true ) {
    if (WVar9 == 0) {
      undef();
      *(undefined4 *)candidateName.field_2._8_8_ = 0;
      EVar2 = undef::theUndef.undefSym.st_value;
      *(undefined8 *)(candidateName.field_2._8_8_ + 8) = undef::theUndef.undefSym._0_8_;
      *(Elf64_Addr *)(candidateName.field_2._8_8_ + 0x10) = EVar2;
      *(Elf64_Xword *)(candidateName.field_2._8_8_ + 0x18) = undef::theUndef.undefSym.st_size;
      return (pair<unsigned_int,_Elf64_Sym> *)candidateName.field_2._8_8_;
    }
    Reader::readObj<Elf64_Sym>
              ((this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)WVar9 * 0x18,(value_type *)auStack_70,1);
    peVar1 = (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar1->_vptr_Reader[7])(&candidate.st_size,peVar1,(ulong)(uint)auStack_70._0_4_);
    EVar3 = candidate.st_size;
    if ((candidateName._M_dataplus._M_p == (pointer)name->_M_string_length) &&
       ((candidateName._M_dataplus._M_p == (pointer)0x0 ||
        (iVar6 = bcmp((void *)candidate.st_size,(name->_M_dataplus)._M_p,
                      (size_t)candidateName._M_dataplus._M_p), iVar6 == 0)))) break;
    if ((size_type *)EVar3 != &candidateName._M_string_length) {
      operator_delete((void *)EVar3,candidateName._M_string_length + 1);
    }
    WVar9 = this->chains[WVar9];
  }
  uVar4 = candidateName.field_2._8_8_;
  *(Word *)candidateName.field_2._8_8_ = WVar9;
  *(ulong *)(candidateName.field_2._8_8_ + 8) = CONCAT44(auStack_70._4_4_,auStack_70._0_4_);
  *(undefined8 *)(candidateName.field_2._8_8_ + 0x10) = candidate._0_8_;
  *(Elf64_Addr *)(candidateName.field_2._8_8_ + 0x18) = candidate.st_value;
  if ((size_type *)EVar3 == &candidateName._M_string_length) {
    return (pair<unsigned_int,_Elf64_Sym> *)candidateName.field_2._8_8_;
  }
  operator_delete((void *)EVar3,candidateName._M_string_length + 1);
  return (pair<unsigned_int,_Elf64_Sym> *)uVar4;
}

Assistant:

std::pair<uint32_t, Sym>
SymHash::findSymbol(const string &name)
{
    uint32_t bucket = elf_hash(name) % nbucket;
    for (Word i = buckets[bucket]; i != STN_UNDEF; i = chains[i]) {
        auto candidate = syms->readObj<Sym>(i * sizeof (Sym));
        auto candidateName = strings->readString(candidate.st_name);
        if (candidateName == name)
            return std::make_pair(i, candidate);
    }
    return std::make_pair(0, undef());
}